

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O0

number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::maxAbsNzo(SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this,bool unscaled)

{
  long *plVar1;
  type_conflict5 tVar2;
  int iVar3;
  byte in_DL;
  cpp_dec_float<50U,_int,_void> *in_RSI;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RDI;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_00000008;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  m_1;
  int i_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  m;
  int i;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *maxi;
  undefined4 in_stack_ffffffffffffff08;
  int iVar4;
  int in_stack_ffffffffffffff0c;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar5;
  undefined1 local_d8 [56];
  int local_a0;
  undefined1 local_9c [56];
  int local_64;
  undefined8 local_60;
  byte local_51;
  undefined8 local_40;
  undefined8 *local_38;
  undefined1 *local_28;
  undefined1 *local_18;
  undefined8 *local_8;
  
  local_51 = in_DL & 1;
  local_60 = 0;
  local_38 = &local_60;
  local_40 = 0;
  pSVar5 = in_RDI;
  local_8 = local_38;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (in_RSI,(double)in_RDI,in_RDI);
  if (((local_51 & 1) == 0) || ((in_RSI[8].data._M_elems[3] & 1) == 0)) {
    local_a0 = 0;
    while (iVar4 = local_a0,
          iVar3 = nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)0x2c6f3e), iVar4 < iVar3) {
      colVector(in_RDI,in_stack_ffffffffffffff0c);
      SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::maxAbs(in_stack_00000008);
      tVar2 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT44(in_stack_ffffffffffffff0c,iVar4),
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x2c6f71);
      if (tVar2) {
        local_28 = local_d8;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  ((cpp_dec_float<50U,_int,_void> *)in_RDI,
                   (cpp_dec_float<50U,_int,_void> *)CONCAT44(in_stack_ffffffffffffff0c,iVar4));
      }
      local_a0 = local_a0 + 1;
    }
  }
  else {
    local_64 = 0;
    while (iVar4 = local_64,
          iVar3 = nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)0x2c6e99), iVar4 < iVar3) {
      plVar1 = *(long **)(in_RSI[8].data._M_elems + 4);
      (**(code **)(*plVar1 + 0x90))(local_9c,plVar1,in_RSI,local_64);
      tVar2 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT44(iVar4,in_stack_ffffffffffffff08),
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x2c6ed3);
      if (tVar2) {
        local_18 = local_9c;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  ((cpp_dec_float<50U,_int,_void> *)in_RDI,
                   (cpp_dec_float<50U,_int,_void> *)CONCAT44(iVar4,in_stack_ffffffffffffff08));
      }
      local_64 = local_64 + 1;
    }
  }
  return (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *)pSVar5;
}

Assistant:

inline
R SPxLPBase<R>::maxAbsNzo(bool unscaled) const
{
   R maxi = 0.0;

   if(unscaled && _isScaled)
   {
      assert(lp_scaler != nullptr);

      for(int i = 0; i < nCols(); ++i)
      {
         R m = lp_scaler->getColMaxAbsUnscaled(*this, i);

         if(m > maxi)
            maxi = m;
      }
   }
   else
   {
      for(int i = 0; i < nCols(); ++i)
      {
         R m = colVector(i).maxAbs();

         if(m > maxi)
            maxi = m;
      }
   }

   assert(maxi >= 0.0);

   return maxi;
}